

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O3

void __thiscall
TwoValuesWithHashCollision_LevelTenCollisionInsert_Test::TestBody
          (TwoValuesWithHashCollision_LevelTenCollisionInsert_Test *this)

{
  value_reference_type ppVar1;
  char *pcVar2;
  char *in_R9;
  transaction_type t1;
  AssertHelper local_3d0;
  undefined8 local_3c8;
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  _Alloc_hider local_390;
  size_type local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  AssertHelper local_370;
  undefined8 local_368;
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  index_pointer local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  undefined8 local_330;
  index_pointer local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320 [11];
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_268;
  bool local_260;
  transaction<std::unique_lock<mock_mutex>_> local_258;
  undefined1 local_220 [8];
  index_pointer local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  _Alloc_hider local_200;
  index_pointer local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0 [11];
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_138;
  bool local_130;
  undefined1 local_128 [232];
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_40;
  
  local_220 = (undefined1  [8])
              &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture
               .field_0x10;
  local_218.internal_ = local_218.internal_ & 0xffffffffffffff00;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_220);
  local_218.addr_.a_._0_1_ = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_258,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,(unique_lock<mock_mutex> *)local_220);
  local_350 = (undefined1  [8])(local_350 + 0x10);
  local_340._M_local_buf[1] = '\0';
  local_3a0._M_local_buf[1] = 'a';
  local_3a0._M_local_buf[2] = 'l';
  local_3a0._M_allocated_capacity._3_4_ = 0x66206575;
  local_3a0._M_local_buf[7] = '\0';
  local_210._M_allocated_capacity._0_2_ = 0x66;
  local_210._M_allocated_capacity._2_6_ = local_340._M_allocated_capacity._2_6_;
  local_210._10_4_ = local_340._10_4_;
  local_210._14_2_ = local_340._14_2_;
  local_218 = (index_pointer)0x1;
  local_348.internal_ = (internal_node *)0x0;
  local_340._M_local_buf[0] = '\0';
  local_1f0[0]._0_8_ = 0x662065756c6176;
  local_1f8 = (index_pointer)0x7;
  local_3a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3a0._M_local_buf[0] = '\0';
  local_3b0 = (undefined1  [8])&local_3a0;
  local_220 = (undefined1  [8])&local_210;
  local_200._M_p = (pointer)local_1f0;
  pstore::index::
  hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
  ::insert_or_upsert<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_128,
             (hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
              *)(this->super_TwoValuesWithHashCollision).index_._M_t.
                super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
                ._M_head_impl,&local_258.super_transaction_base,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_220,false);
  if ((_Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       )local_40._M_head_impl !=
      (_Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       )0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_40,local_40._M_head_impl);
  }
  local_40._M_head_impl =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_p != local_1f0) {
    operator_delete(local_200._M_p,local_1f0[0]._M_allocated_capacity + 1);
  }
  if (local_220 != (undefined1  [8])&local_210) {
    operator_delete((void *)local_220,
                    CONCAT62(local_210._M_allocated_capacity._2_6_,
                             local_210._M_allocated_capacity._0_2_) + 1);
  }
  pcVar2 = local_350 + 0x10;
  if (local_3b0 != (undefined1  [8])&local_3a0) {
    operator_delete((void *)local_3b0,
                    CONCAT17(local_3a0._M_local_buf[7],
                             CONCAT43(local_3a0._M_allocated_capacity._3_4_,
                                      CONCAT12(local_3a0._M_local_buf[2],
                                               CONCAT11(local_3a0._M_local_buf[1],
                                                        local_3a0._M_local_buf[0])))) + 1);
  }
  if (local_350 != (undefined1  [8])pcVar2) {
    operator_delete((void *)local_350,
                    CONCAT62(local_340._M_allocated_capacity._2_6_,
                             CONCAT11(local_340._M_local_buf[1],local_340._M_local_buf[0])) + 1);
  }
  local_3a0._M_local_buf[1] = '\0';
  local_3c0._4_2_ = 0x2065;
  local_3c0[6] = 0x65;
  local_3c0[1] = 0x61;
  local_3c0[2] = 'l';
  local_3c0[3] = 0x75;
  local_3c0[7] = '\0';
  local_340._M_local_buf[0] = 'e';
  local_340._M_local_buf[1] = '\0';
  local_340._M_allocated_capacity._2_6_ =
       CONCAT15(local_3a0._M_local_buf[7],
                CONCAT41(local_3a0._M_allocated_capacity._3_4_,local_3a0._M_local_buf[2]));
  local_340._10_4_ = local_3a0._10_4_;
  local_340._14_2_ = local_3a0._14_2_;
  local_348 = (index_pointer)0x1;
  local_3a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3a0._M_local_buf[0] = '\0';
  local_320[0]._0_4_ = 0x756c6176;
  local_320[0]._M_allocated_capacity._4_2_ = 0x2065;
  local_320[0]._M_local_buf[6] = 'e';
  local_320[0]._M_local_buf[7] = '\0';
  local_328 = (index_pointer)0x7;
  local_3c8 = 0;
  local_3c0[0] = 0;
  local_3d0.data_ = (AssertHelperData *)local_3c0;
  local_3b0 = (undefined1  [8])&local_3a0;
  local_350 = (undefined1  [8])pcVar2;
  local_330 = local_350 + 0x30;
  pstore::index::
  hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
  ::insert_or_upsert<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_220,
             (hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
              *)(this->super_TwoValuesWithHashCollision).index_._M_t.
                super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
                ._M_head_impl,&local_258.super_transaction_base,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_350,false);
  if ((undefined1 *)local_330 != local_350 + 0x30) {
    operator_delete((void *)local_330,
                    CONCAT17(local_320[0]._M_local_buf[7],
                             CONCAT16(local_320[0]._M_local_buf[6],
                                      CONCAT24(local_320[0]._M_allocated_capacity._4_2_,
                                               (undefined4)local_320[0]._M_allocated_capacity))) + 1
                   );
  }
  if (local_350 != (undefined1  [8])pcVar2) {
    operator_delete((void *)local_350,
                    CONCAT62(local_340._M_allocated_capacity._2_6_,
                             CONCAT11(local_340._M_local_buf[1],local_340._M_local_buf[0])) + 1);
  }
  if (local_3d0.data_ != (AssertHelperData *)local_3c0) {
    operator_delete(local_3d0.data_,
                    CONCAT17(local_3c0[7],
                             CONCAT16(local_3c0[6],
                                      CONCAT24(local_3c0._4_2_,
                                               CONCAT13(local_3c0[3],
                                                        CONCAT12(local_3c0[2],
                                                                 CONCAT11(local_3c0[1],local_3c0[0])
                                                                ))))) + 1);
  }
  if (local_3b0 != (undefined1  [8])&local_3a0) {
    operator_delete((void *)local_3b0,
                    CONCAT17(local_3a0._M_local_buf[7],
                             CONCAT43(local_3a0._M_allocated_capacity._3_4_,
                                      CONCAT12(local_3a0._M_local_buf[2],
                                               CONCAT11(local_3a0._M_local_buf[1],
                                                        local_3a0._M_local_buf[0])))) + 1);
  }
  local_3b0[0] = local_130;
  local_3a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_130 == false) {
    testing::Message::Message((Message *)&local_3d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_350,(internal *)local_3b0,(AssertionResult *)"itp.second","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x470,(char *)local_350);
    testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    if (local_350 != (undefined1  [8])pcVar2) {
      operator_delete((void *)local_350,
                      CONCAT62(local_340._M_allocated_capacity._2_6_,
                               CONCAT11(local_340._M_local_buf[1],local_340._M_local_buf[0])) + 1);
    }
    if (local_3d0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3d0.data_ + 8))();
    }
    if (local_3a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3a8,local_3a8);
    }
  }
  ppVar1 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*((iterator_base<false> *)local_220);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)local_350,"\"value e\"","v",(char (*) [8])0x20a2ee,&ppVar1->second);
  if (local_350[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3b0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348.internal_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)((local_348.internal_)->signature_)._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x472,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_3b0 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_3b0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348.internal_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_350 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_348.internal_);
  }
  local_3c0[1] = 0;
  local_360._1_6_ = 0x6c6176207765;
  local_360[7] = 0x75;
  local_360._8_2_ = 0x2065;
  local_360[10] = 0x65;
  local_360[0xb] = 0;
  local_3a0._M_local_buf[0] = 'e';
  local_3a0._M_local_buf[1] = '\0';
  local_3a0._M_local_buf[2] = local_3c0[2];
  local_3a0._M_allocated_capacity._3_4_ =
       (undefined4)
       (CONCAT14(local_3c0[6],CONCAT22(local_3c0._4_2_,CONCAT11(local_3c0[3],local_3c0[2]))) >> 8);
  local_3a0._M_local_buf[7] = local_3c0[7];
  local_3a0._10_4_ = local_3c0._10_4_;
  local_3a0._14_2_ = local_3c0._14_2_;
  local_3a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_3c8 = 0;
  local_3c0[0] = 0;
  local_380._M_allocated_capacity = 0x756c61762077656e;
  local_380._8_2_ = 0x2065;
  local_380._M_local_buf[10] = 'e';
  local_380._M_local_buf[0xb] = '\0';
  local_380._12_4_ = local_360._12_4_;
  local_388 = 0xb;
  local_368 = 0;
  local_360[0] = kSuccess;
  local_3d0.data_ = (AssertHelperData *)local_3c0;
  local_3b0 = (undefined1  [8])&local_3a0;
  local_390._M_p = (pointer)&local_380;
  local_370.data_ = (AssertHelperData *)local_360;
  pstore::index::
  hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
  ::insert_or_upsert<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_350,
             (hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
              *)(this->super_TwoValuesWithHashCollision).index_._M_t.
                super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
                ._M_head_impl,&local_258.super_transaction_base,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_3b0,false);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator=
            ((iterator_base<false> *)local_220,(iterator_base<false> *)local_350);
  local_130 = local_260;
  if (local_268._M_head_impl !=
      (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_268,local_268._M_head_impl);
  }
  local_268._M_head_impl =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_p != &local_380) {
    operator_delete(local_390._M_p,local_380._M_allocated_capacity + 1);
  }
  if (local_3b0 != (undefined1  [8])&local_3a0) {
    operator_delete((void *)local_3b0,
                    CONCAT17(local_3a0._M_local_buf[7],
                             CONCAT43(local_3a0._M_allocated_capacity._3_4_,
                                      CONCAT12(local_3a0._M_local_buf[2],
                                               CONCAT11(local_3a0._M_local_buf[1],
                                                        local_3a0._M_local_buf[0])))) + 1);
  }
  if (local_370.data_ != (AssertHelperData *)local_360) {
    operator_delete(local_370.data_,
                    CONCAT17(local_360[7],CONCAT61(local_360._1_6_,local_360[0])) + 1);
  }
  if (local_3d0.data_ != (AssertHelperData *)local_3c0) {
    operator_delete(local_3d0.data_,
                    CONCAT17(local_3c0[7],
                             CONCAT16(local_3c0[6],
                                      CONCAT24(local_3c0._4_2_,
                                               CONCAT13(local_3c0[3],
                                                        CONCAT12(local_3c0[2],
                                                                 CONCAT11(local_3c0[1],local_3c0[0])
                                                                ))))) + 1);
  }
  local_3b0 = (undefined1  [8])(CONCAT71(local_3b0._1_7_,local_130) ^ 1);
  local_3a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_130 != false) {
    testing::Message::Message((Message *)&local_3d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_350,(internal *)local_3b0,(AssertionResult *)"itp.second","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x475,(char *)local_350);
    testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    if (local_350 != (undefined1  [8])(local_350 + 0x10)) {
      operator_delete((void *)local_350,
                      CONCAT62(local_340._M_allocated_capacity._2_6_,
                               CONCAT11(local_340._M_local_buf[1],local_340._M_local_buf[0])) + 1);
    }
    if (local_3d0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3d0.data_ + 8))();
    }
    if (local_3a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3a8,local_3a8);
    }
  }
  ppVar1 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*((iterator_base<false> *)local_220);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)local_350,"\"value e\"","v1",(char (*) [8])0x20a2ee,&ppVar1->second);
  if (local_350[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3b0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348.internal_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)((local_348.internal_)->signature_)._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x477,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_3b0 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_3b0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348.internal_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_350 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_348.internal_);
  }
  if ((_Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       )local_138._M_head_impl !=
      (_Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       )0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_138,local_138._M_head_impl);
  }
  local_258.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_0026b340
  ;
  pstore::transaction_base::rollback(&local_258.super_transaction_base);
  return;
}

Assistant:

TEST_F (TwoValuesWithHashCollision, LevelTenCollisionInsert) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    index_->insert (t1, std::make_pair ("f"s, "value f"s));
    std::pair<test_trie::iterator, bool> itp =
        index_->insert (t1, std::make_pair ("e"s, "value e"s));
    EXPECT_TRUE (itp.second);
    std::string const & v = (*itp.first).second;
    EXPECT_EQ ("value e", v);

    itp = index_->insert (t1, std::make_pair ("e"s, "new value e"s));
    EXPECT_FALSE (itp.second);
    std::string const & v1 = (*itp.first).second;
    EXPECT_EQ ("value e", v1);
}